

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr_conflict docu)

{
  xmlRelaxNGPtr pxVar1;
  xmlRelaxNGDefinePtr_conflict *ppxVar2;
  long lVar3;
  
  if (docu->href != (xmlChar *)0x0) {
    (*xmlFree)(docu->href);
  }
  if (docu->doc != (xmlDocPtr)0x0) {
    xmlFreeDoc(docu->doc);
  }
  pxVar1 = docu->schema;
  if (pxVar1 != (xmlRelaxNGPtr)0x0) {
    if (pxVar1->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(pxVar1->doc);
    }
    ppxVar2 = pxVar1->defTab;
    if (ppxVar2 != (xmlRelaxNGDefinePtr_conflict *)0x0) {
      if (0 < pxVar1->defNr) {
        lVar3 = 0;
        do {
          xmlRelaxNGFreeDefine(pxVar1->defTab[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < pxVar1->defNr);
        ppxVar2 = pxVar1->defTab;
      }
      (*xmlFree)(ppxVar2);
    }
    (*xmlFree)(pxVar1);
  }
  (*xmlFree)(docu);
  return;
}

Assistant:

static void
xmlRelaxNGFreeDocument(xmlRelaxNGDocumentPtr docu)
{
    if (docu == NULL)
        return;

    if (docu->href != NULL)
        xmlFree(docu->href);
    if (docu->doc != NULL)
        xmlFreeDoc(docu->doc);
    if (docu->schema != NULL)
        xmlRelaxNGFreeInnerSchema(docu->schema);
    xmlFree(docu);
}